

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O3

OffsetEntry * get_offset(File *fp,char *name,...)

{
  OffsetEntry **ppOVar1;
  OffsetEntry *pOVar2;
  ulong uVar3;
  char in_AL;
  uint uVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [256];
  undefined8 local_208;
  void **local_200;
  undefined1 *local_1f8;
  char local_1e8 [256];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_1f8 = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_200 = &ap[0].overflow_arg_area;
  local_208 = 0x3000000010;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  uVar4 = vsnprintf(local_1e8,0x100,name,&local_208);
  if (0xff < uVar4) {
    __assert_fail("n < 256 && n >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                  ,0xd2,"OffsetEntry *get_offset(File *, char *, ...)");
  }
  sVar7 = strlen(local_1e8);
  uVar5 = strhashl(local_1e8,(int)sVar7);
  uVar4 = (fp->entries).n;
  if (uVar4 != 0) {
    ppOVar1 = (fp->entries).v;
    iVar8 = 5;
    do {
      uVar3 = (ulong)uVar5 % (ulong)uVar4;
      pOVar2 = ppOVar1[uVar3];
      if (pOVar2 == (OffsetEntry *)0x0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                      ,0xbf,"OffsetEntry *search_for_offset(File *, char *)");
      }
      iVar6 = strcmp(pOVar2->name,local_1e8);
      if (iVar6 == 0) {
        return pOVar2;
      }
      uVar5 = (int)uVar3 + 1;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                ,0xc6,"OffsetEntry *search_for_offset(File *, char *)");
}

Assistant:

static OffsetEntry *get_offset(File *fp, char *name, ...) {
  int n;
  char buf[256];
  va_list ap;
  va_start(ap, name);
  n = vsnprintf(buf, sizeof(buf), name, ap);
  (void)n;
  va_end(ap);
  assert(n < 256 && n >= 0);
  return search_for_offset(fp, buf);
}